

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentFragmentImpl.cpp
# Opt level: O2

DOMNode * __thiscall
xercesc_4_0::DOMDocumentFragmentImpl::cloneNode(DOMDocumentFragmentImpl *this,bool deep)

{
  long *plVar1;
  long lVar2;
  DOMNodeImpl *this_00;
  DOMDocument *doc;
  DOMDocumentFragmentImpl *this_01;
  DOMException *this_02;
  
  plVar1 = (long *)__dynamic_cast(this,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                  0xfffffffffffffffe);
  if (plVar1 != (long *)0x0) {
    lVar2 = (**(code **)(*plVar1 + 0x18))(plVar1);
    if (lVar2 != 0) {
      this_00 = (DOMNodeImpl *)(**(code **)(*plVar1 + 0x18))(plVar1);
      doc = DOMNodeImpl::getOwnerDocument(this_00);
      this_01 = (DOMDocumentFragmentImpl *)operator_new(0x60,doc,DOCUMENT_FRAGMENT_OBJECT);
      DOMDocumentFragmentImpl(this_01,this,deep);
      DOMNodeImpl::callUserDataHandlers(&this->fNode,NODE_CLONED,(DOMNode *)this,(DOMNode *)this_01)
      ;
      return (DOMNode *)this_01;
    }
  }
  this_02 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
  __cxa_throw(this_02,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMDocumentFragmentImpl::cloneNode(bool deep) const
{
    DOMNode* newNode = new (castToNodeImpl(this)->getOwnerDocument(), DOMMemoryManager::DOCUMENT_FRAGMENT_OBJECT) DOMDocumentFragmentImpl(*this, deep);
    fNode.callUserDataHandlers(DOMUserDataHandler::NODE_CLONED, this, newNode);
    return newNode;
}